

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O1

float scasum(int n,complex<float> *x,int incx)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (0 < incx && 0 < n) {
    if (incx == 1) {
      fVar3 = 0.0;
      uVar1 = 0;
      do {
        fVar3 = ABS(*(float *)((long)&x[uVar1]._M_value + 4)) +
                ABS(*(float *)&x[uVar1]._M_value) + fVar3;
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
    }
    else {
      pfVar2 = (float *)((long)&x->_M_value + 4);
      fVar3 = 0.0;
      do {
        fVar3 = ABS(*pfVar2) + ABS(pfVar2[-1]) + fVar3;
        pfVar2 = pfVar2 + (ulong)(uint)incx * 2;
        n = n + -1;
      } while (n != 0);
    }
  }
  return fVar3;
}

Assistant:

float scasum ( int n, complex <float> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SCASUM takes the sum of the absolute values of a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, float SCASUM, the sum of the absolute values.
//
{
  int i;
  int ix;
  float value;

  value = 0.0;

  if ( n <= 0 || incx <= 0 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[i] ) )
                    + fabs ( imag ( x[i] ) );
    }
  }
  else
  {
    ix = 0;
    for ( i = 0; i < n; i++ )
    {
      value = value + fabs ( real ( x[ix] ) )
                    + fabs ( imag ( x[ix] ) );
      ix = ix + incx;
    }
  }
  return value;
}